

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraKateGenerator::CreateDummyKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  string *psVar1;
  ostream *poVar2;
  string filename;
  cmGeneratedFileStream fout;
  string sStack_298;
  cmGeneratedFileStream local_278;
  
  psVar1 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  local_278.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream.
  _0_1_ = 0x2f;
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[13]>
            (&sStack_298,psVar1,(char *)&local_278,&this->ProjectName,(char (*) [13])0x6d17f8);
  cmGeneratedFileStream::cmGeneratedFileStream(&local_278,&sStack_298,false,None);
  if (((&local_278.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [*(long *)(CONCAT71(local_278.super_ofstream.
                           super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream.
                           _1_7_,local_278.super_ofstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream._0_1_) + -0x18)] & 5) == 0) {
    poVar2 = std::operator<<((ostream *)&local_278,"#Generated by ");
    psVar1 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,(string *)psVar1);
    std::operator<<(poVar2,", do not edit.\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
  std::__cxx11::string::~string((string *)&sStack_298);
  return;
}

Assistant:

void cmExtraKateGenerator::CreateDummyKateProjectFile(
  const cmLocalGenerator& lg) const
{
  std::string filename =
    cmStrCat(lg.GetBinaryDirectory(), '/', this->ProjectName, ".kateproject");
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  fout << "#Generated by " << cmSystemTools::GetCMakeCommand()
       << ", do not edit.\n";
}